

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiOldColumnData>::push_back(ImVector<ImGuiOldColumnData> *this,ImGuiOldColumnData *v)

{
  ImRect *pIVar1;
  ImGuiOldColumnData *pIVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  ImGuiOldColumnFlags IVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  int new_capacity;
  
  iVar9 = this->Size;
  if (iVar9 == this->Capacity) {
    if (iVar9 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar9 / 2 + iVar9;
    }
    new_capacity = iVar9 + 1;
    if (iVar9 + 1 < iVar8) {
      new_capacity = iVar8;
    }
    reserve(this,new_capacity);
    iVar9 = this->Size;
  }
  pIVar2 = this->Data;
  fVar4 = v->OffsetNorm;
  fVar5 = v->OffsetNormBeforeResize;
  IVar6 = v->Flags;
  fVar7 = (v->ClipRect).Min.x;
  IVar3 = (v->ClipRect).Max;
  pIVar1 = &pIVar2[iVar9].ClipRect;
  pIVar1->Min = (v->ClipRect).Min;
  pIVar1->Max = IVar3;
  pIVar2 = pIVar2 + iVar9;
  pIVar2->OffsetNorm = fVar4;
  pIVar2->OffsetNormBeforeResize = fVar5;
  pIVar2->Flags = IVar6;
  (pIVar2->ClipRect).Min.x = fVar7;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }